

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

bool __thiscall
slang::parsing::Lexer::scanUTF8Char(Lexer *this,bool alreadyErrored,uint32_t *code,int *computedLen)

{
  char *b;
  char *pcVar1;
  char *pcVar2;
  undefined7 in_register_00000031;
  int iVar3;
  char *__n;
  int error;
  char buf [4];
  int local_3c;
  undefined4 local_38;
  char local_34 [4];
  
  local_38 = (undefined4)CONCAT71(in_register_00000031,alreadyErrored);
  b = this->sourceBuffer;
  if (b + 4 < this->sourceEnd) {
    pcVar1 = utf8Decode(b,code,&local_3c,computedLen);
    this->sourceBuffer = pcVar1;
  }
  else {
    local_34[0] = '\0';
    local_34[1] = '\0';
    local_34[2] = '\0';
    local_34[3] = '\0';
    __n = this->sourceEnd + ~(ulong)b;
    memcpy(local_34,b,(size_t)__n);
    pcVar2 = utf8Decode(local_34,code,&local_3c,computedLen);
    pcVar1 = pcVar2 + -(long)local_34;
    if ((long)__n < (long)(pcVar2 + -(long)local_34)) {
      pcVar1 = __n;
    }
    this->sourceBuffer = this->sourceBuffer + (long)pcVar1;
    iVar3 = (int)__n;
    if (*computedLen < (int)__n) {
      iVar3 = *computedLen;
    }
    *computedLen = iVar3;
  }
  if (local_3c == 0) goto LAB_0066ec90;
  iVar3 = *computedLen;
  if ((iVar3 < 2) || ('\x1f' < b[1])) {
    if ((2 < iVar3) && (b[2] < ' ')) {
      pcVar1 = b + 2;
      goto LAB_0066ec60;
    }
    if ((3 < iVar3) && (b[3] < ' ')) {
      pcVar1 = b + 3;
      goto LAB_0066ec60;
    }
  }
  else {
    pcVar1 = b + 1;
LAB_0066ec60:
    this->sourceBuffer = pcVar1;
  }
  if ((char)local_38 == '\0') {
    Diagnostics::add(this->diagnostics,(DiagCode)0x140002,
                     (SourceLocation)
                     (((long)b - (long)this->originalBegin) * 0x10000000 |
                     (ulong)((this->bufferId).id & 0xfffffff)));
  }
LAB_0066ec90:
  return local_3c == 0;
}

Assistant:

bool Lexer::scanUTF8Char(bool alreadyErrored, uint32_t* code, int& computedLen) {
    int error;
    auto curr = sourceBuffer;
    if (sourceBuffer + 4 < sourceEnd) {
        sourceBuffer = utf8Decode(sourceBuffer, code, &error, computedLen);
    }
    else {
        char buf[4] = {};
        auto spaceLeft = sourceEnd - sourceBuffer - 1;
        memcpy(buf, sourceBuffer, size_t(spaceLeft));

        auto next = utf8Decode(buf, code, &error, computedLen);
        sourceBuffer += std::min(next - buf, spaceLeft);
        computedLen = std::min(computedLen, (int)spaceLeft);
    }

    if (error) {
        // if error, trim next pointer so that control char is read as next char
        if ((computedLen > 1) && (curr[1] < 0x20))
            sourceBuffer = curr + 1;
        else if ((computedLen > 2) && (curr[2] < 0x20))
            sourceBuffer = curr + 2;
        else if ((computedLen > 3) && (curr[3] < 0x20))
            sourceBuffer = curr + 3;

        if (!alreadyErrored)
            addDiag(diag::InvalidUTF8Seq, (size_t)(curr - originalBegin));
        return false;
    }

    return true;
}